

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp.hpp
# Opt level: O0

void __thiscall
so_5::disp::adv_thread_pool::impl::agent_queue_t::push
          (agent_queue_t *this,execution_demand_t *demand)

{
  bool bVar1;
  demand_t *this_00;
  lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_> local_40;
  lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_> lock;
  demand_t *new_demand;
  bool need_schedule;
  execution_demand_t *demand_local;
  agent_queue_t *this_local;
  
  bVar1 = false;
  this_00 = (demand_t *)operator_new(0x38);
  demand_t::demand_t(this_00,demand);
  std::lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_>::lock_guard(&local_40,&this->m_lock);
  this->m_tail->m_next = this_00;
  this->m_tail = this->m_tail->m_next;
  std::__atomic_base<unsigned_long>::operator++(&(this->m_size).super___atomic_base<unsigned_long>);
  if (((this->m_head).m_next == this->m_tail) && ((this->m_active & 1U) == 0)) {
    bVar1 = is_there_not_thread_safe_worker(this);
    bVar1 = !bVar1;
    if (bVar1) {
      this->m_active = true;
    }
  }
  std::lock_guard<so_5::spinlock_t<so_5::yield_backoff_t>_>::~lock_guard(&local_40);
  if (bVar1) {
    reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::schedule
              (this->m_disp_queue,this);
  }
  return;
}

Assistant:

virtual void
		push( execution_demand_t demand )
			{
				bool need_schedule = false;
				{
					// Do memory allocation before spinlock locking.
					auto new_demand = new demand_t( std::move( demand ) );

					std::lock_guard< spinlock_t > lock( m_lock );

					m_tail->m_next = new_demand;
					m_tail = m_tail->m_next;

					++m_size;

					if( m_head.m_next == m_tail )
						{
							// Queue was empty. Need to detect
							// necessity of queue activation.
							if( !m_active )
								if( !is_there_not_thread_safe_worker() )
								{
									need_schedule = true;
									m_active = true;
								}
						}

					SO_5_CHECK_INVARIANT( !empty(), this )
					SO_5_CHECK_INVARIANT( m_active || is_there_any_worker(), this )
					SO_5_CHECK_INVARIANT( !(need_schedule && !m_active), this )
				}

				if( need_schedule )
					m_disp_queue.schedule( this );
			}